

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressionTables.cpp
# Opt level: O1

void testQuantizer(float tol)

{
  char cVar1;
  uint16_t herrTol;
  uint16_t uVar2;
  uint16_t uVar3;
  float fVar4;
  uint uVar5;
  uint16_t src;
  int h;
  ulong uVar6;
  
  fVar4 = ABS(tol);
  herrTol = (ushort)((uint)tol >> 0x10) & 0x8000;
  if ((uint)fVar4 < 0x38800000) {
    if ((0x33000000 < (uint)fVar4) &&
       (uVar5 = (uint)tol & 0x7fffff | 0x800000, cVar1 = (char)((uint)fVar4 >> 0x17),
       herrTol = herrTol | (ushort)(uVar5 >> (0x7eU - cVar1 & 0x1f)),
       0x80000000 < uVar5 << (cVar1 + 0xa2U & 0x1f))) {
      herrTol = herrTol + 1;
    }
  }
  else if ((uint)fVar4 < 0x7f800000) {
    if ((uint)fVar4 < 0x477ff000) {
      herrTol = (ushort)((int)fVar4 + 0x8000fffU + (uint)(((uint)fVar4 >> 0xd & 1) != 0) >> 0xd) |
                herrTol;
    }
    else {
      herrTol = herrTol | 0x7c00;
    }
  }
  else {
    herrTol = herrTol | 0x7c00;
    if (fVar4 != INFINITY) {
      uVar5 = (uint)fVar4 >> 0xd & 0x3ff;
      herrTol = herrTol | (ushort)uVar5 | (ushort)(uVar5 == 0);
    }
  }
  uVar6 = 0;
  uVar5 = 0;
  do {
    fVar4 = *(float *)(_imath_half_to_float_table + uVar6 * 4);
    src = (uint16_t)uVar6;
    uVar2 = tableQuantize(src,tol,fVar4,0);
    uVar3 = algoQuantize(src,herrTol,tol,fVar4,0);
    if ((uVar2 != uVar3) && (uVar5 = uVar5 + 1, testQuantizer(float)::didfirstprint == '\0')) {
      uVar2 = tableQuantize(src,tol,fVar4,1);
      uVar3 = algoQuantize(src,herrTol,tol,fVar4,1);
      testQuantizer(float)::didfirstprint = '\x01';
      printf("ERROR: tol %g half %u 0x%04X %g: table 0x%04X %g algo 0x%04X %g\n",
             SUB84((double)tol,0),(double)*(float *)(_imath_half_to_float_table + uVar6 * 4),
             (double)*(float *)(_imath_half_to_float_table + (ulong)uVar2 * 4),
             (double)*(float *)(_imath_half_to_float_table + (ulong)uVar3 * 4),uVar6 & 0xffffffff,
             uVar6 & 0xffffffff);
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != 0x10000);
  if (0 < (int)uVar5) {
    printf("ERROR: tol %g: %d fails\n",SUB84((double)tol,0),(ulong)uVar5);
    return;
  }
  return;
}

Assistant:

static void testQuantizer (float tol)
{
    uint16_t halfTol = imath_float_to_half (tol);

    int failcount = 0;
    for ( int h = 0; h < 65536; ++h )
    {
        uint16_t hval = h;
        float    hFloat = imath_half_to_float (hval);
        uint16_t tq = tableQuantize (hval, tol, hFloat, 0);
        uint16_t aq = algoQuantize (hval, halfTol, tol, hFloat, 0);

        if (tq != aq)
        {
            static int didfirstprint = 0;
            ++failcount;
            if (didfirstprint == 0)
            {
                tq = tableQuantize (hval, tol, hFloat, 1);
                aq = algoQuantize (hval, halfTol, tol, hFloat, 1);
                didfirstprint = 1;
                printf ("ERROR: tol %g half %u 0x%04X %g: table 0x%04X %g algo 0x%04X %g\n",
                        tol, hval, hval, imath_half_to_float (hval),
                        tq, imath_half_to_float (tq),
                        aq, imath_half_to_float (aq));
            }
        }
        //EXRCORE_TEST (tableQuantize (hval, tol) == algoQuantize (hval, halfTol));
    }
    if (failcount > 0)
        printf ("ERROR: tol %g: %d fails\n", tol, failcount);
    //else
    //    printf ("SUCCESS: tol %g: %d fails\n", tol, failcount);
}